

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmRestrictions.cpp
# Opt level: O3

__GMM_BUFFER_TYPE * __thiscall
GmmLib::GmmTextureCalc::GetBestRestrictions
          (GmmTextureCalc *this,__GMM_BUFFER_TYPE *pFirstBuffer,__GMM_BUFFER_TYPE *pSecondBuffer)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  __GMM_BUFFER_TYPE *p_Var6;
  byte bVar7;
  
  bVar7 = 0;
  iVar2 = (*this->_vptr_GmmTextureCalc[3])();
  if ((char)iVar2 == '\0') {
    uVar3 = pSecondBuffer->Alignment;
    if (pSecondBuffer->Alignment < pFirstBuffer->Alignment) {
      uVar3 = pFirstBuffer->Alignment;
    }
    pFirstBuffer->Alignment = uVar3;
    uVar3 = pSecondBuffer->PitchAlignment;
    if (pSecondBuffer->PitchAlignment < pFirstBuffer->PitchAlignment) {
      uVar3 = pFirstBuffer->PitchAlignment;
    }
    pFirstBuffer->PitchAlignment = uVar3;
    uVar3 = pSecondBuffer->RenderPitchAlignment;
    if (pSecondBuffer->RenderPitchAlignment < pFirstBuffer->RenderPitchAlignment) {
      uVar3 = pFirstBuffer->RenderPitchAlignment;
    }
    pFirstBuffer->RenderPitchAlignment = uVar3;
    uVar3 = pSecondBuffer->LockPitchAlignment;
    if (pSecondBuffer->LockPitchAlignment < pFirstBuffer->LockPitchAlignment) {
      uVar3 = pFirstBuffer->LockPitchAlignment;
    }
    pFirstBuffer->LockPitchAlignment = uVar3;
    uVar3 = pSecondBuffer->MinPitch;
    if (pSecondBuffer->MinPitch < pFirstBuffer->MinPitch) {
      uVar3 = pFirstBuffer->MinPitch;
    }
    pFirstBuffer->MinPitch = uVar3;
    uVar5 = pSecondBuffer->MinAllocationSize;
    if (pSecondBuffer->MinAllocationSize < pFirstBuffer->MinAllocationSize) {
      uVar5 = pFirstBuffer->MinAllocationSize;
    }
    pFirstBuffer->MinAllocationSize = uVar5;
    uVar3 = pSecondBuffer->MinDepth;
    if (pSecondBuffer->MinDepth < pFirstBuffer->MinDepth) {
      uVar3 = pFirstBuffer->MinDepth;
    }
    pFirstBuffer->MinDepth = uVar3;
    uVar3 = pSecondBuffer->MinHeight;
    if (pSecondBuffer->MinHeight < pFirstBuffer->MinHeight) {
      uVar3 = pFirstBuffer->MinHeight;
    }
    pFirstBuffer->MinHeight = uVar3;
    uVar5 = pSecondBuffer->MinWidth;
    if (pSecondBuffer->MinWidth < pFirstBuffer->MinWidth) {
      uVar5 = pFirstBuffer->MinWidth;
    }
    pFirstBuffer->MinWidth = uVar5;
    uVar3 = pSecondBuffer->MaxDepth;
    if (pFirstBuffer->MaxDepth < pSecondBuffer->MaxDepth) {
      uVar3 = pFirstBuffer->MaxDepth;
    }
    pFirstBuffer->MaxDepth = uVar3;
    uVar5 = pSecondBuffer->MaxHeight;
    if (pFirstBuffer->MaxHeight < pSecondBuffer->MaxHeight) {
      uVar5 = pFirstBuffer->MaxHeight;
    }
    pFirstBuffer->MaxHeight = uVar5;
    uVar5 = pSecondBuffer->MaxWidth;
    if (pFirstBuffer->MaxWidth < pSecondBuffer->MaxWidth) {
      uVar5 = pFirstBuffer->MaxWidth;
    }
    pFirstBuffer->MaxWidth = uVar5;
    pFirstBuffer->NeedPow2LockAlignment =
         pFirstBuffer->NeedPow2LockAlignment | pSecondBuffer->NeedPow2LockAlignment;
  }
  else {
    p_Var6 = pFirstBuffer;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = pSecondBuffer->PitchAlignment;
      p_Var6->Alignment = pSecondBuffer->Alignment;
      p_Var6->PitchAlignment = uVar1;
      pSecondBuffer = (__GMM_BUFFER_TYPE *)((long)pSecondBuffer + (ulong)bVar7 * -0x10 + 8);
      p_Var6 = (__GMM_BUFFER_TYPE *)((long)p_Var6 + (ulong)bVar7 * -0x10 + 8);
    }
  }
  return pFirstBuffer;
}

Assistant:

__GMM_BUFFER_TYPE *GmmLib::GmmTextureCalc::GetBestRestrictions(__GMM_BUFFER_TYPE *      pFirstBuffer,
                                                               const __GMM_BUFFER_TYPE *pSecondBuffer)
{
    GMM_DPF_ENTER;

    if(IsRestrictionInvalid(pFirstBuffer)) //default
    {
        *pFirstBuffer = *pSecondBuffer;
        return pFirstBuffer;
    }

    pFirstBuffer->Alignment = GFX_MAX(pFirstBuffer->Alignment,
                                      pSecondBuffer->Alignment);

    pFirstBuffer->PitchAlignment = GFX_MAX(pFirstBuffer->PitchAlignment,
                                           pSecondBuffer->PitchAlignment);

    pFirstBuffer->RenderPitchAlignment = GFX_MAX(pFirstBuffer->RenderPitchAlignment,
                                                 pSecondBuffer->RenderPitchAlignment);

    pFirstBuffer->LockPitchAlignment = GFX_MAX(pFirstBuffer->LockPitchAlignment,
                                               pSecondBuffer->LockPitchAlignment);

    pFirstBuffer->MinPitch = GFX_MAX(pFirstBuffer->MinPitch,
                                     pSecondBuffer->MinPitch);

    pFirstBuffer->MinAllocationSize = GFX_MAX(pFirstBuffer->MinAllocationSize,
                                              pSecondBuffer->MinAllocationSize);

    pFirstBuffer->MinDepth = GFX_MAX(pFirstBuffer->MinDepth,
                                     pSecondBuffer->MinDepth);

    pFirstBuffer->MinHeight = GFX_MAX(pFirstBuffer->MinHeight,
                                      pSecondBuffer->MinHeight);

    pFirstBuffer->MinWidth = GFX_MAX(pFirstBuffer->MinWidth,
                                     pSecondBuffer->MinWidth);

    pFirstBuffer->MaxDepth = GFX_MIN(pFirstBuffer->MaxDepth,
                                     pSecondBuffer->MaxDepth);

    pFirstBuffer->MaxHeight = GFX_MIN(pFirstBuffer->MaxHeight,
                                      pSecondBuffer->MaxHeight);

    pFirstBuffer->MaxWidth = GFX_MIN(pFirstBuffer->MaxWidth,
                                     pSecondBuffer->MaxWidth);

    pFirstBuffer->NeedPow2LockAlignment = pFirstBuffer->NeedPow2LockAlignment |
                                          pSecondBuffer->NeedPow2LockAlignment;

    GMM_DPF_EXIT;
    return pFirstBuffer;
}